

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::checkRangeOverflow<slang::ast::ASTContext_const>
          (ast *this,ConstantRange range,ASTContext *context,SourceRange sourceRange)

{
  int iVar1;
  long lVar2;
  SourceRange sourceRange_00;
  
  sourceRange_00.endLoc = sourceRange.startLoc;
  iVar1 = (int)this;
  lVar2 = ((long)this >> 0x20) - (long)iVar1;
  if ((int)((ulong)this >> 0x20) < iVar1) {
    lVar2 = (long)iVar1 - ((long)this >> 0x20);
  }
  if (lVar2 - 0x7fffffffU < 0xffffffff80000000) {
    sourceRange_00.startLoc = (SourceLocation)context;
    ASTContext::addDiag((ASTContext *)range,(DiagCode)0x8b0007,sourceRange_00);
  }
  return lVar2 - 0x7fffffffU < 0xffffffff80000000;
}

Assistant:

static bool checkRangeOverflow(ConstantRange range, TContext& context, SourceRange sourceRange) {
    if (range.fullWidth() > INT32_MAX) {
        context.addDiag(diag::RangeWidthOverflow, sourceRange);
        return true;
    }
    return false;
}